

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

nghttp2_outbound_item * nghttp2_session_get_next_ob_item(nghttp2_session *session)

{
  int iVar1;
  nghttp2_outbound_item *pnVar2;
  nghttp2_session *in_RDI;
  nghttp2_outbound_item *item;
  nghttp2_session *in_stack_fffffffffffffff8;
  
  if ((in_RDI->ob_urgent).head == (nghttp2_outbound_item *)0x0) {
    if ((in_RDI->ob_reg).head == (nghttp2_outbound_item *)0x0) {
      iVar1 = session_is_outgoing_concurrent_streams_max(in_RDI);
      if ((iVar1 == 0) && ((in_RDI->ob_syn).head != (nghttp2_outbound_item *)0x0)) {
        pnVar2 = (in_RDI->ob_syn).head;
      }
      else if (in_RDI->remote_window_size < 1) {
        pnVar2 = (nghttp2_outbound_item *)0x0;
      }
      else {
        pnVar2 = nghttp2_stream_next_outbound_item((nghttp2_stream *)in_stack_fffffffffffffff8);
        if (pnVar2 == (nghttp2_outbound_item *)0x0) {
          pnVar2 = session_sched_get_next_outbound_item(in_stack_fffffffffffffff8);
        }
      }
    }
    else {
      pnVar2 = (in_RDI->ob_reg).head;
    }
  }
  else {
    pnVar2 = (in_RDI->ob_urgent).head;
  }
  return pnVar2;
}

Assistant:

nghttp2_outbound_item *
nghttp2_session_get_next_ob_item(nghttp2_session *session) {
  nghttp2_outbound_item *item;

  if (nghttp2_outbound_queue_top(&session->ob_urgent)) {
    return nghttp2_outbound_queue_top(&session->ob_urgent);
  }

  if (nghttp2_outbound_queue_top(&session->ob_reg)) {
    return nghttp2_outbound_queue_top(&session->ob_reg);
  }

  if (!session_is_outgoing_concurrent_streams_max(session)) {
    if (nghttp2_outbound_queue_top(&session->ob_syn)) {
      return nghttp2_outbound_queue_top(&session->ob_syn);
    }
  }

  if (session->remote_window_size > 0) {
    item = nghttp2_stream_next_outbound_item(&session->root);
    if (item) {
      return item;
    }

    return session_sched_get_next_outbound_item(session);
  }

  return NULL;
}